

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl.hpp
# Opt level: O0

void __thiscall cs::instance_type::instance_type(instance_type *this,context_t *c,size_t stack_size)

{
  stack_pointer *in_RDX;
  runtime_type *in_RSI;
  shared_ptr<cs::context_type> *in_RDI;
  size_t in_stack_ffffffffffffffe0;
  
  runtime_type::runtime_type(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x19c466);
  in_RDI[0x10].super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  in_RDI[0x11].super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       &in_RDI[0x10].super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  *(undefined1 *)
   &in_RDI[0x11].super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = 0;
  *(undefined1 *)
   ((long)&in_RDI[0x11].super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi + 1) = 0;
  *(undefined1 *)
   ((long)&in_RDI[0x11].super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi + 2) = 0;
  std::shared_ptr<cs::context_type>::shared_ptr(in_RDI,(shared_ptr<cs::context_type> *)in_RSI);
  return;
}

Assistant:

instance_type(context_t c, std::size_t stack_size) : context(std::move(c)), runtime_type(fiber_sp, stack_size), fiber_stack(fiber_sp) {}